

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_records_stop.c
# Opt level: O3

void CGTFS_DatabaseStop(void)

{
  int iVar1;
  feed_db_status_t fVar2;
  feed_db_t db;
  feed_db_t local_410;
  stop_t local_3e8;
  
  iVar1 = greatest_test_pre("db_stop_store");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      memcpy(&local_3e8,&DAT_001e99d0,0x3b0);
      init_feed_db(&local_410,"tests_tdw0.db",1);
      setup_feed_db(&local_410);
      fVar2 = store_stop_db(&local_3e8,&local_410);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar2 == FEED_DB_SUCCESS) {
        free_feed_db(&local_410);
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",1);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)fVar2);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_database_records/tests-database_records_stop.c"
        ;
        greatest_info.fail_line = 0x20;
        greatest_info.msg = local_410.error_msg;
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
      }
    }
    greatest_test_post(iVar1);
  }
  return;
}

Assistant:

SUITE(CGTFS_DatabaseStop) {
    RUN_TEST(db_stop_store);
}